

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

ssize_t __thiscall vox::SIZE::write(SIZE *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  FILE *__s;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  id = 0x455a4953;
  fwrite(&id,4,1,__s);
  contentSize = 0xc;
  fwrite(&contentSize,4,1,__s);
  childSize = 0;
  fwrite(&childSize,4,1,__s);
  fwrite(this,4,1,__s);
  fwrite(&this->sizey,4,1,__s);
  sVar1 = fwrite(&this->sizez,4,1,__s);
  return sVar1;
}

Assistant:

void SIZE::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('S', 'I', 'Z', 'E');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&sizex, sizeof(int32_t), 1, fp);
    fwrite(&sizey, sizeof(int32_t), 1, fp);
    fwrite(&sizez, sizeof(int32_t), 1, fp);
}